

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllRgbWidget.cpp
# Opt level: O0

void __thiscall AllRgbWidget::onUpdateFromAlgorithm(AllRgbWidget *this,QImage *allRgb)

{
  QRect local_40;
  QImage local_30 [24];
  QImage *local_18;
  QImage *allRgb_local;
  AllRgbWidget *this_local;
  
  local_18 = allRgb;
  allRgb_local = (QImage *)this;
  QRect::QRect(&local_40);
  QImage::copy((QRect *)local_30);
  QImage::operator=(&this->allRgb_,local_30);
  QImage::~QImage(local_30);
  QWidget::update();
  return;
}

Assistant:

void AllRgbWidget::onUpdateFromAlgorithm(QImage allRgb)
{
    allRgb_ = allRgb.copy();
    update();
}